

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,DoWhileLoopStatement *stmt)

{
  bool bVar1;
  Expression *this_00;
  DataFlowState *exitState;
  type oldBreakStates;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_240;
  DataFlowState local_218;
  SmallVector<slang::analysis::DataFlowState,_2UL> local_178;
  
  SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
            (&local_178,&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  SmallVectorBase<slang::analysis::DataFlowState>::clear
            (&(this->breakStates).super_SmallVectorBase<slang::analysis::DataFlowState>);
  ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt->body,(DataFlowAnalysis *)this);
  this_00 = stmt->cond;
  bVar1 = this->inCondition;
  this->inCondition = true;
  ast::Expression::visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
            (this_00,this_00,(DataFlowAnalysis *)this);
  this->inCondition = bVar1;
  adjustConditionalState((ConstantValue *)&local_240,this,this_00);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_240);
  exitState = &local_218;
  SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
            (&exitState->assigned,(Base *)&this->stateWhenFalse);
  local_218.reachable = (this->stateWhenFalse).reachable;
  loopTail(this,exitState,&local_178);
  if (local_218.assigned.
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
      (pointer)local_218.assigned.
               super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
               firstElement) {
    operator_delete(local_218.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_);
  }
  SmallVectorBase<slang::analysis::DataFlowState>::cleanup
            (&local_178.super_SmallVectorBase<slang::analysis::DataFlowState>,
             (EVP_PKEY_CTX *)exitState);
  return;
}

Assistant:

void visitStmt(const DoWhileLoopStatement& stmt) {
        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        visit(stmt.body);

        visitCondition(stmt.cond);

        loopTail(std::move(stateWhenFalse), std::move(oldBreakStates));
    }